

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastGtS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  TcParseTableBase *pTVar1;
  ParseContext *pPVar2;
  ParseContext *pPVar3;
  byte bVar4;
  bool bVar5;
  unsigned_short uVar6;
  uint16_t uVar7;
  uint uVar8;
  int iVar9;
  uint32_t uVar10;
  int iVar11;
  char *pcVar12;
  uint *puVar13;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar14;
  FieldAux *pFVar15;
  MessageLite *pMVar16;
  EpsCopyInputStream *this;
  TailCallParseFunc p_Var17;
  EpsCopyInputStream *pEVar18;
  LogMessage *pLVar19;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_class_24_3_cc722eaf inner_loop;
  TcParseTableBase *inner_table;
  FieldAux aux;
  MessageLite **field;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_180;
  unsigned_short saved_tag;
  uint64_t local_178;
  TcParseTableBase *local_170;
  ParseContext *local_168;
  char *local_160;
  MessageLite *local_158;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_150 [2];
  uint local_13c;
  TcParseTableBase *pTStack_138;
  uint32_t has_bits_offset;
  ulong local_130;
  MessageLite *local_128;
  Arena *local_120;
  TcParseTableBase *local_118;
  LogMessage local_110;
  Voidify local_f9;
  Nullable<const_char_*> local_f8;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_d9;
  Nullable<const_char_*> local_d8;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int old_group_depth;
  int old_depth;
  uint32_t local_bc;
  char *local_b8;
  ParseContext *local_b0;
  char *local_a8;
  char *local_a0;
  TcFieldData *local_98;
  TcFieldData local_90;
  EpsCopyInputStream *local_88;
  ParseContext *local_80;
  char *local_78;
  MessageLite *local_70;
  char *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  local_178 = hasbits;
  local_170 = table;
  local_168 = ctx;
  local_160 = ptr;
  local_158 = msg;
  local_150[0] = data.field_0;
  uVar6 = TcFieldData::coded_tag<unsigned_short>((TcFieldData *)local_150);
  pMVar16 = local_158;
  pcVar12 = local_160;
  pPVar2 = local_168;
  if (uVar6 != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffe80);
    pcVar12 = MiniParse(pMVar16,pcVar12,pPVar2,(TcFieldData)aStack_180,local_170,local_178);
    return pcVar12;
  }
  uVar6 = UnalignedLoad<unsigned_short>(local_160);
  local_160 = local_160 + 2;
  bVar4 = TcFieldData::hasbit_idx((TcFieldData *)local_150);
  local_178 = 1L << (bVar4 & 0x3f) | local_178;
  local_128 = local_158;
  pTStack_138 = local_170;
  local_13c = (uint)local_170->has_bits_offset;
  local_130 = local_178;
  if (local_13c != 0) {
    uVar8 = (uint)local_178;
    puVar13 = RefAt<unsigned_int>(local_158,(ulong)local_13c);
    *puVar13 = uVar8 | *puVar13;
  }
  pMVar16 = local_158;
  uVar7 = TcFieldData::offset((TcFieldData *)local_150);
  aVar14 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           RefAt<google::protobuf::MessageLite*>(pMVar16,(ulong)uVar7);
  pTVar1 = local_170;
  bVar4 = TcFieldData::aux_idx((TcFieldData *)local_150);
  pFVar15 = TcParseTableBase::field_aux(pTVar1,(uint)bVar4);
  pTVar1 = pFVar15->table;
  inner_loop.inner_table = (TcParseTableBase **)pTVar1;
  if (*(MessageLite **)aVar14 == (MessageLite *)0x0) {
    local_120 = MessageLite::GetArena(local_158);
    local_118 = pTVar1;
    pMVar16 = ClassData::New(pTVar1->class_data,local_120);
    *(MessageLite **)aVar14 = pMVar16;
  }
  pcVar12 = local_160;
  pPVar2 = local_168;
  inner_loop.field = (MessageLite **)&local_168;
  inner_loop.ctx = (ParseContext **)&inner_loop.inner_table;
  data_local.field_0 = aVar14;
  local_bc = FastDecodeTag(uVar6);
  local_b0 = pPVar2;
  local_b8 = pcVar12;
  _old_group_depth = &data_local;
  iVar9 = pPVar2->depth_ + -1;
  pPVar2->depth_ = iVar9;
  if (iVar9 < 0) {
    local_a8 = (char *)0x0;
  }
  else {
    pPVar2->group_depth_ = pPVar2->group_depth_ + 1;
    absl_log_internal_check_op_result._4_4_ = pPVar2->depth_;
    absl_log_internal_check_op_result._0_4_ = pPVar2->group_depth_;
    local_a0 = pcVar12;
    local_70 = *(MessageLite **)data_local.field_0;
    local_80 = (ParseContext *)*inner_loop.field;
    local_78 = pcVar12;
    local_88 = (EpsCopyInputStream *)
               (((*inner_loop.ctx)->super_EpsCopyInputStream).patch_buffer_ + 0x10);
    local_98 = _old_group_depth;
    while (bVar5 = ParseContext::Done(local_80,&local_78), pMVar16 = local_70, pcVar12 = local_78,
          pPVar3 = local_80, ((bVar5 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_90);
      pEVar18 = local_88;
      this = (EpsCopyInputStream *)((long)local_88 + -0x38);
      uVar6 = UnalignedLoad<unsigned_short>(pcVar12);
      if (((long)(int)((uint)uVar6 & (uint)*(byte *)((long)pEVar18 + -0x30)) & 7U) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      data_1.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           TcParseTableBase::fast_entry
                     ((TcParseTableBase *)this,
                      (ulong)(long)(int)((uint)uVar6 & (uint)*(byte *)((long)pEVar18 + -0x30)) >> 3)
      ;
      local_58.data =
           (ulong)uVar6 ^
           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data;
      p_Var17 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
      local_60.data = local_58.data;
      local_78 = (*p_Var17)(pMVar16,pcVar12,pPVar3,(TcFieldData)local_58,(TcParseTableBase *)this,0)
      ;
      if ((local_78 == (char *)0x0) ||
         (uVar10 = EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream), uVar10 != 1))
      break;
    }
    pEVar18 = (EpsCopyInputStream *)((long)local_88 + -0x38);
    if ((*(byte *)((long)local_88 + -0x2f) & 1) == 0) {
      local_88 = pEVar18;
      if (local_78 == (char *)0x0) {
        VerifyHasBitConsistency(local_70,(TcParseTableBase *)pEVar18);
      }
      local_68 = local_78;
    }
    else {
      pcVar12 = (char *)((long)local_88 + -0x10);
      local_88 = pEVar18;
      local_68 = (char *)(**(code **)pcVar12)(local_70,local_78,local_80);
    }
    local_b8 = local_68;
    if (local_68 != (char *)0x0) {
      iVar9 = absl::lts_20250127::log_internal::GetReferenceableValue
                        (absl_log_internal_check_op_result._4_4_);
      iVar11 = absl::lts_20250127::log_internal::GetReferenceableValue(pPVar2->depth_);
      local_d8 = absl::lts_20250127::log_internal::Check_EQImpl(iVar9,iVar11,"old_depth == depth_");
      if (local_d8 != (Nullable<const_char_*>)0x0) {
        pcVar12 = absl::lts_20250127::implicit_cast<char_const*>(local_d8);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x491,pcVar12);
        pLVar19 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                            ((LogMessage *)&absl_log_internal_check_op_result_1);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_d9,pLVar19);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
      }
      iVar9 = absl::lts_20250127::log_internal::GetReferenceableValue
                        ((int)absl_log_internal_check_op_result);
      iVar11 = absl::lts_20250127::log_internal::GetReferenceableValue(pPVar2->group_depth_);
      local_f8 = absl::lts_20250127::log_internal::Check_EQImpl
                           (iVar9,iVar11,"old_group_depth == group_depth_");
      if (local_f8 != (Nullable<const_char_*>)0x0) {
        pcVar12 = absl::lts_20250127::implicit_cast<char_const*>(local_f8);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_110,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x492,pcVar12);
        pLVar19 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_110);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_f9,pLVar19);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_110);
      }
      local_f8 = (Nullable<const_char_*>)0x0;
    }
    pPVar2->group_depth_ = pPVar2->group_depth_ + -1;
    pPVar2->depth_ = pPVar2->depth_ + 1;
    bVar5 = EpsCopyInputStream::ConsumeEndGroup(&pPVar2->super_EpsCopyInputStream,local_bc);
    if (((bVar5 ^ 0xffU) & 1) == 0) {
      local_a8 = local_b8;
    }
    else {
      local_a8 = (char *)0x0;
    }
  }
  return local_a8;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint16_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}